

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastReduceMatrix2(Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Int_t *vRes,int fSigned,int fCla)

{
  Vec_Int_t *pVVar1;
  Vec_Wec_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int Lit;
  int iVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  int local_54;
  int nSize;
  int Start;
  int Node3;
  int Node2;
  int Node1;
  int NodeC;
  int NodeS;
  int i;
  Vec_Int_t *vTemp;
  Vec_Int_t *vProd;
  int fCla_local;
  int fSigned_local;
  Vec_Int_t *vRes_local;
  Vec_Wec_t *vProds_local;
  Gia_Man_t *pNew_local;
  
  vProd._0_4_ = fCla;
  vProd._4_4_ = fSigned;
  _fCla_local = vRes;
  vRes_local = (Vec_Int_t *)vProds;
  vProds_local = (Vec_Wec_t *)pNew;
  local_54 = Wlc_BlastAddLevel(pNew,0);
  iVar3 = Vec_WecSize((Vec_Wec_t *)vRes_local);
  for (NodeC = 0; iVar5 = NodeC, iVar4 = Vec_WecSize((Vec_Wec_t *)vRes_local), iVar5 < iVar4;
      NodeC = NodeC + 1) {
    vTemp = Vec_WecEntry((Vec_Wec_t *)vRes_local,NodeC);
    pVVar2 = vProds_local;
    piVar8 = Vec_IntArray(vTemp);
    iVar5 = Vec_IntSize(vTemp);
    Wlc_IntSortCostReverse((Gia_Man_t *)pVVar2,piVar8,iVar5);
  }
  NodeC = 0;
  do {
    if (iVar3 <= NodeC) {
      NodeC = 0;
      while( true ) {
        if (iVar3 <= NodeC) {
          Vec_IntClear(_fCla_local);
          _NodeS = Vec_IntAlloc(100);
          for (NodeC = 0; NodeC < iVar3; NodeC = NodeC + 1) {
            vTemp = Vec_WecEntry((Vec_Wec_t *)vRes_local,NodeC);
            pVVar1 = _fCla_local;
            iVar5 = Vec_IntEntry(vTemp,0);
            Vec_IntPush(pVVar1,iVar5);
            pVVar1 = _NodeS;
            iVar5 = Vec_IntEntry(vTemp,1);
            Vec_IntPush(pVVar1,iVar5);
          }
          Vec_IntPush(_fCla_local,0);
          Vec_IntPush(_NodeS,0);
          pVVar2 = vProds_local;
          if ((int)vProd == 0) {
            piVar8 = Vec_IntArray(_fCla_local);
            piVar9 = Vec_IntArray(_NodeS);
            iVar3 = Vec_IntSize(_fCla_local);
            Wlc_BlastAdder((Gia_Man_t *)pVVar2,piVar8,piVar9,iVar3,0);
          }
          else {
            piVar8 = Vec_IntArray(_fCla_local);
            piVar9 = Vec_IntArray(_NodeS);
            iVar3 = Vec_IntSize(_fCla_local);
            Wlc_BlastAdderCLA((Gia_Man_t *)pVVar2,piVar8,piVar9,iVar3,vProd._4_4_,0);
          }
          Vec_IntFree(_NodeS);
          return;
        }
        vTemp = Vec_WecEntry((Vec_Wec_t *)vRes_local,NodeC);
        while (iVar5 = Vec_IntSize(vTemp), iVar5 < 2) {
          Vec_IntPush(vTemp,0);
        }
        iVar5 = Vec_IntSize(vTemp);
        if (iVar5 != 2) break;
        NodeC = NodeC + 1;
      }
      __assert_fail("Vec_IntSize(vProd) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                    ,0x3ea,
                    "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)");
    }
    while( true ) {
      vTemp = Vec_WecEntry((Vec_Wec_t *)vRes_local,NodeC);
      iVar5 = Vec_IntSize(vTemp);
      if (iVar5 < 3) break;
      iVar5 = Vec_IntPop(vTemp);
      iVar4 = Vec_IntPop(vTemp);
      Lit = Vec_IntPop(vTemp);
      pVVar2 = vProds_local;
      iVar6 = Abc_Lit2Var(Lit);
      iVar6 = Gia_ObjLevelId((Gia_Man_t *)pVVar2,iVar6);
      pVVar2 = vProds_local;
      iVar7 = Abc_Lit2Var(iVar4);
      iVar7 = Gia_ObjLevelId((Gia_Man_t *)pVVar2,iVar7);
      pVVar2 = vProds_local;
      if (iVar6 < iVar7) {
        __assert_fail("Gia_ObjLevelId(pNew, Abc_Lit2Var(Node3)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                      ,0x3d7,
                      "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                     );
      }
      iVar6 = Abc_Lit2Var(iVar4);
      iVar6 = Gia_ObjLevelId((Gia_Man_t *)pVVar2,iVar6);
      pVVar2 = vProds_local;
      iVar7 = Abc_Lit2Var(iVar5);
      iVar7 = Gia_ObjLevelId((Gia_Man_t *)pVVar2,iVar7);
      if (iVar6 < iVar7) {
        __assert_fail("Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node1))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcBlast.c"
                      ,0x3d8,
                      "void Wlc_BlastReduceMatrix2(Gia_Man_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                     );
      }
      Wlc_BlastFullAdder((Gia_Man_t *)vProds_local,iVar5,iVar4,Lit,&Node2,&Node1);
      local_54 = Wlc_BlastAddLevel((Gia_Man_t *)vProds_local,local_54);
      Wlc_IntInsert2((Gia_Man_t *)vProds_local,vTemp,Node1);
      vTemp = Vec_WecEntry((Vec_Wec_t *)vRes_local,NodeC + 1);
      Wlc_IntInsert2((Gia_Man_t *)vProds_local,vTemp,Node2);
    }
    NodeC = NodeC + 1;
  } while( true );
}

Assistant:

void Wlc_BlastReduceMatrix2( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Int_t * vProd, * vTemp;
    int i, NodeS, NodeC, Node1, Node2, Node3;
    int Start = Wlc_BlastAddLevel( pNew, 0 );
    int nSize = Vec_WecSize(vProds);
    Vec_WecForEachLevel( vProds, vProd, i )
        Wlc_IntSortCostReverse( pNew, Vec_IntArray(vProd), Vec_IntSize(vProd) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            assert( Gia_ObjLevelId(pNew, Abc_Lit2Var(Node3)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) );
            assert( Gia_ObjLevelId(pNew, Abc_Lit2Var(Node2)) >= Gia_ObjLevelId(pNew, Abc_Lit2Var(Node1)) );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            Start = Wlc_BlastAddLevel( pNew, Start );

            Wlc_IntInsert2( pNew, vProd, NodeS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            Wlc_IntInsert2( pNew, vProd, NodeC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }
//    Vec_WecPrint( vProds, 0 );

    Vec_IntClear( vRes );
    vTemp = Vec_IntAlloc( 100 );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,  Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vTemp, Vec_IntEntry(vProd, 1) );
    }
    Vec_IntPush( vRes,  0 );
    Vec_IntPush( vTemp, 0 );

    if ( fCla )
        Wlc_BlastAdderCLA( pNew, Vec_IntArray(vRes), Vec_IntArray(vTemp), Vec_IntSize(vRes), fSigned, 0 );
    else
        Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vTemp), Vec_IntSize(vRes), 0 );
    Vec_IntFree( vTemp );
}